

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O3

void __thiscall xmrig::Network::onActive(Network *this,IStrategy *strategy,IClient *client)

{
  ushort uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char *pcVar6;
  
  NetworkState::onActive(&this->m_state,client);
  iVar3 = (*client->_vptr_IClient[8])(client);
  iVar4 = (*client->_vptr_IClient[6])(client);
  iVar5 = (*client->_vptr_IClient[10])(client);
  uVar2 = *(undefined8 *)(CONCAT44(extraout_var_01,iVar5) + 0x90);
  iVar5 = (*client->_vptr_IClient[10])(client);
  uVar1 = *(ushort *)(CONCAT44(extraout_var_02,iVar5) + 0xb0);
  pcVar6 = "";
  if ((char *)CONCAT44(extraout_var,iVar3) != (char *)0x0) {
    pcVar6 = (char *)CONCAT44(extraout_var,iVar3);
  }
  iVar3 = (*client->_vptr_IClient[0xb])(client);
  Log::print(INFO,
             "%s \x1b[1;37muse %s \x1b[0m\x1b[1;36m%s:%d \x1b[0m\x1b[1;32m%s\x1b[0m \x1b[1;30m%s\x1b[0m"
             ,"\x1b[44;1m\x1b[1;37m net \x1b[0m",CONCAT44(extraout_var_00,iVar4),uVar2,(ulong)uVar1,
             pcVar6,*(undefined8 *)CONCAT44(extraout_var_03,iVar3));
  iVar3 = (*client->_vptr_IClient[7])(client);
  if (CONCAT44(extraout_var_04,iVar3) != 0) {
    Log::print(INFO,"%s \x1b[1;30mfingerprint (SHA-256): \"%s\"\x1b[0m",
               "\x1b[44;1m\x1b[1;37m net \x1b[0m",CONCAT44(extraout_var_04,iVar3));
    return;
  }
  return;
}

Assistant:

void xmrig::Network::onActive(IStrategy *strategy, IClient *client)
{
    m_state.onActive(client);

    const char *tlsVersion = client->tlsVersion();
    LOG_INFO("%s " WHITE_BOLD("use %s ") CYAN_BOLD("%s:%d ") GREEN_BOLD("%s") " " BLACK_BOLD("%s"),
             tag, client->mode(), client->pool().host().data(), client->pool().port(), tlsVersion ? tlsVersion : "", client->ip().data());

    const char *fingerprint = client->tlsFingerprint();
    if (fingerprint != nullptr) {
        LOG_INFO("%s " BLACK_BOLD("fingerprint (SHA-256): \"%s\""), tag, fingerprint);
    }
}